

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slcan_attach.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int extraout_EAX;
  size_t sVar11;
  ssize_t sVar12;
  char *pcVar13;
  int ldisc;
  char buf [20];
  undefined4 local_64;
  char *local_60;
  undefined8 local_58;
  char *local_50;
  char local_48 [24];
  
  local_64 = 0x11;
  local_58 = 0;
  bVar6 = false;
  bVar4 = false;
  local_60 = (char *)0x0;
  bVar5 = false;
  local_50 = (char *)0x0;
  bVar3 = false;
  pcVar13 = (char *)0x0;
  bVar7 = false;
  do {
    bVar2 = bVar7;
    iVar8 = getopt(argc,argv,"ldwocfs:b:n:?");
    pcVar1 = _optarg;
    bVar7 = true;
    switch(iVar8) {
    case 0x62:
      local_60 = _optarg;
      sVar11 = strlen(_optarg);
      bVar7 = bVar2;
      if (8 < sVar11) goto switchD_0010155c_caseD_65;
      break;
    case 99:
      bVar6 = true;
      bVar7 = bVar2;
      break;
    case 100:
      break;
    case 0x65:
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6d:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x75:
    case 0x76:
      goto switchD_0010155c_caseD_65;
    case 0x66:
      bVar4 = true;
      bVar7 = bVar2;
      break;
    case 0x6c:
      local_58 = 1;
      bVar7 = bVar2;
      break;
    case 0x6e:
      local_50 = _optarg;
      sVar11 = strlen(_optarg);
      bVar7 = bVar2;
      if (0xf < sVar11) goto switchD_0010155c_caseD_65;
      break;
    case 0x6f:
      bVar5 = true;
      bVar7 = bVar2;
      break;
    case 0x73:
      sVar11 = strlen(_optarg);
      pcVar13 = pcVar1;
      bVar7 = bVar2;
      if (1 < sVar11) {
switchD_0010155c_caseD_65:
        print_usage(*argv);
LAB_00101900:
        main_cold_10();
LAB_00101908:
        main_cold_9();
LAB_0010190d:
        main_cold_8();
LAB_00101912:
        main_cold_7();
LAB_00101917:
        main_cold_6();
LAB_0010191c:
        main_cold_1();
LAB_00101921:
        main_cold_2();
LAB_00101926:
        main_cold_3();
LAB_0010192b:
        main_cold_5();
        return extraout_EAX;
      }
      break;
    case 0x77:
      bVar3 = true;
      bVar7 = bVar2;
      break;
    default:
      if ((iVar8 == -1) && (argc - _optind == 1)) {
        pcVar1 = argv[_optind];
        iVar8 = open(pcVar1,0x101);
        if (iVar8 < 0) goto LAB_00101900;
        if (bVar3 || !bVar2) {
          if (pcVar13 != (char *)0x0) {
            sprintf(local_48,"C\rS%s\r",pcVar13);
            sVar11 = strlen(local_48);
            sVar12 = write(iVar8,local_48,sVar11);
            if (sVar12 < 1) goto LAB_0010191c;
          }
          if (local_60 != (char *)0x0) {
            sprintf(local_48,"C\rs%s\r");
            sVar11 = strlen(local_48);
            sVar12 = write(iVar8,local_48,sVar11);
            if (sVar12 < 1) goto LAB_00101921;
          }
          if (bVar4) {
            local_48[2] = 0;
            local_48[0] = 'F';
            local_48[1] = '\r';
            sVar11 = strlen(local_48);
            sVar12 = write(iVar8,local_48,sVar11);
            if (sVar12 < 1) goto LAB_00101926;
          }
          pcVar13 = local_50;
          if ((int)local_58 == 0) {
LAB_00101747:
            if (bVar5) {
              local_48[2] = 0;
              local_48[0] = 'O';
              local_48[1] = '\r';
              sVar11 = strlen(local_48);
              sVar12 = write(iVar8,local_48,sVar11);
              if (sVar12 < 1) goto LAB_0010192b;
            }
          }
          else {
            local_48[2] = 0;
            local_48[0] = 'L';
            local_48[1] = '\r';
            sVar11 = strlen(local_48);
            sVar12 = write(iVar8,local_48,sVar11);
            if (sVar12 < 1) {
              main_cold_4();
              goto LAB_00101747;
            }
          }
          iVar9 = ioctl(iVar8,0x5423,&local_64);
          if (iVar9 < 0) goto LAB_00101912;
          iVar9 = ioctl(iVar8,0x8910,&main::ifr);
          if (iVar9 < 0) goto LAB_00101917;
          printf("attached tty %s to netdevice %s\n",pcVar1,&main::ifr);
          if (pcVar13 != (char *)0x0) {
            iVar9 = socket(2,2,0);
            printf("rename netdevice %s to %s ... ",local_48,pcVar13);
            if (iVar9 < 0) {
              perror("socket for interface rename");
            }
            else {
              main::ifr.ifr_ifru.ifru_map.mem_start = 0;
              main::ifr.ifr_ifru.ifru_map.mem_end = 0;
              strncpy(main::ifr.ifr_ifru.ifru_slave,pcVar13,0xf);
              iVar10 = ioctl(iVar9,0x8923,&main::ifr);
              pcVar13 = "ok.";
              if (iVar10 < 0) {
                pcVar13 = "failed!";
              }
              puts(pcVar13);
              close(iVar9);
            }
          }
          if (bVar3) {
            printf("Press any key to detach %s ...\n",pcVar1);
            getchar();
          }
          else if (!bVar2) goto LAB_001018cf;
        }
        local_64 = 0;
        iVar9 = ioctl(iVar8,0x5423);
        if (iVar9 < 0) goto LAB_00101908;
        if (bVar6) {
          local_48[2] = 0;
          local_48[0] = 'C';
          local_48[1] = '\r';
          sVar11 = strlen(local_48);
          sVar12 = write(iVar8,local_48,sVar11);
          if (sVar12 < 1) goto LAB_0010190d;
        }
LAB_001018cf:
        close(iVar8);
        return 0;
      }
      goto switchD_0010155c_caseD_65;
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
	int fd;
	int ldisc = N_SLCAN;
	int detach = 0;
	int waitkey = 0;
	int send_open = 0;
	int send_listen = 0;
	int send_close = 0;
	int send_read_status_flags = 0;
	char *speed = NULL;
	char *btr = NULL;
	char buf[20];
	static struct ifreq ifr;
	char *tty;
	char *name = NULL;
	int opt;

	while ((opt = getopt(argc, argv, "ldwocfs:b:n:?")) != -1) {
		switch (opt) {
		case 'd':
			detach = 1;
			break;

		case 'w':
			waitkey = 1;
			break;

		case 'o':
			send_open = 1;
			break;

		case 'l':
			send_listen = 1;
			break;

		case 'c':
			send_close = 1;
			break;

		case 'f':
			send_read_status_flags = 1;
			break;

		case 's':
			speed = optarg;
			if (strlen(speed) > 1)
				print_usage(argv[0]);
			break;

		case 'b':
			btr = optarg;
			if (strlen(btr) > 8)
				print_usage(argv[0]);
			break;

		case 'n':
			name = optarg;
			if (strlen(name) > sizeof(ifr.ifr_newname) - 1)
				print_usage(argv[0]);
			break;

		case '?':
		default:
			print_usage(argv[0]);
			break;
		}
	}

	if (argc - optind != 1)
		print_usage(argv[0]);

	tty = argv[optind];

	if ((fd = open (tty, O_WRONLY | O_NOCTTY)) < 0) {
		perror(tty);
		exit(1);
	}

	if (waitkey || !detach) {

		if (speed) {
			sprintf(buf, "C\rS%s\r", speed);
			if (write(fd, buf, strlen(buf)) <= 0) {
				perror("write");
				exit(EXIT_FAILURE);
			}
		}

		if (btr) {
			sprintf(buf, "C\rs%s\r", btr);
			if (write(fd, buf, strlen(buf)) <= 0) {
				perror("write");
				exit(EXIT_FAILURE);
			}
		}

		if (send_read_status_flags) {
			sprintf(buf, "F\r");
			if (write(fd, buf, strlen(buf)) <= 0) {
				perror("write");
				exit(EXIT_FAILURE);
			}
		}

		if (send_listen) {
			sprintf(buf, "L\r");
			if (write(fd, buf, strlen(buf)) <= 0) {
				perror("write");
				exit(EXIT_FAILURE);
			}
		} else if (send_open) {
			sprintf(buf, "O\r");
			if (write(fd, buf, strlen(buf)) <= 0) {
				perror("write");
				exit(EXIT_FAILURE);
			}
		}

		/* set slcan line discipline on given tty */
		if (ioctl (fd, TIOCSETD, &ldisc) < 0) {
			perror("ioctl TIOCSETD");
			exit(1);
		}

		/* retrieve the name of the created CAN netdevice */
		if (ioctl (fd, SIOCGIFNAME, ifr.ifr_name) < 0) {
			perror("ioctl SIOCGIFNAME");
			exit(1);
		}

		printf("attached tty %s to netdevice %s\n", tty, ifr.ifr_name);

		/* try to rename the created device if requested */
		if (name) {
			int s = socket(PF_INET, SOCK_DGRAM, 0);

			printf("rename netdevice %s to %s ... ", buf, name);

			if (s < 0)
				perror("socket for interface rename");
			else {
				/* current slcan%d name is still in ifr.ifr_name */
				memset (ifr.ifr_newname, 0, sizeof(ifr.ifr_newname));
				strncpy (ifr.ifr_newname, name, sizeof(ifr.ifr_newname) - 1);

				if (ioctl(s, SIOCSIFNAME, &ifr) < 0)
					printf("failed!\n");
				else
					printf("ok.\n");

				close(s);
			}
		}
	}

	if (waitkey) {
		printf("Press any key to detach %s ...\n", tty);
		getchar();
	}

	if (waitkey || detach) {
		ldisc = N_TTY;
		if (ioctl (fd, TIOCSETD, &ldisc) < 0) {
			perror("ioctl");
			exit(1);
		}

		if (send_close) {
			sprintf(buf, "C\r");
			if (write(fd, buf, strlen(buf)) <= 0) {
				perror("write");
				exit(EXIT_FAILURE);
			}
		}
	}

	close(fd);

	return 0;
}